

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::NeuralNetwork::MergeFrom(NeuralNetwork *this,NeuralNetwork *from)

{
  void *pvVar1;
  Rep *pRVar2;
  LogMessage *pLVar3;
  void **our_elems;
  NetworkUpdateParameters *pNVar4;
  int iVar5;
  LogFinisher local_99;
  LogMessage local_98;
  LogMessage local_60;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O1/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x85d);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_60,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_98,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_60);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
            (&(this->layers_).super_RepeatedPtrFieldBase,&(from->layers_).super_RepeatedPtrFieldBase
            );
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_98,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x619);
    pLVar3 = google::protobuf::internal::LogMessage::operator<<
                       (&local_98,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_99,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(&local_98);
  }
  iVar5 = (from->preprocessing_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar5 != 0) {
    pRVar2 = (from->preprocessing_).super_RepeatedPtrFieldBase.rep_;
    our_elems = google::protobuf::internal::RepeatedPtrFieldBase::InternalExtend
                          (&(this->preprocessing_).super_RepeatedPtrFieldBase,iVar5);
    google::protobuf::internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkPreprocessing>::TypeHandler>
              (&(this->preprocessing_).super_RepeatedPtrFieldBase,our_elems,pRVar2->elements,iVar5,
               ((this->preprocessing_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->preprocessing_).super_RepeatedPtrFieldBase.current_size_);
    iVar5 = iVar5 + (this->preprocessing_).super_RepeatedPtrFieldBase.current_size_;
    (this->preprocessing_).super_RepeatedPtrFieldBase.current_size_ = iVar5;
    pRVar2 = (this->preprocessing_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar2->allocated_size < iVar5) {
      pRVar2->allocated_size = iVar5;
    }
  }
  if ((from != (NeuralNetwork *)&_NeuralNetwork_default_instance_) &&
     (from->updateparams_ != (NetworkUpdateParameters *)0x0)) {
    if (this->updateparams_ == (NetworkUpdateParameters *)0x0) {
      pNVar4 = (NetworkUpdateParameters *)operator_new(0x50);
      NetworkUpdateParameters::NetworkUpdateParameters(pNVar4);
      this->updateparams_ = pNVar4;
    }
    pNVar4 = from->updateparams_;
    if (pNVar4 == (NetworkUpdateParameters *)0x0) {
      pNVar4 = (NetworkUpdateParameters *)&_NetworkUpdateParameters_default_instance_;
    }
    NetworkUpdateParameters::MergeFrom(this->updateparams_,pNVar4);
  }
  if (from->arrayinputshapemapping_ != 0) {
    this->arrayinputshapemapping_ = from->arrayinputshapemapping_;
  }
  if (from->imageinputshapemapping_ != 0) {
    this->imageinputshapemapping_ = from->imageinputshapemapping_;
  }
  return;
}

Assistant:

void NeuralNetwork::MergeFrom(const NeuralNetwork& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.NeuralNetwork)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  layers_.MergeFrom(from.layers_);
  preprocessing_.MergeFrom(from.preprocessing_);
  if (from.has_updateparams()) {
    mutable_updateparams()->::CoreML::Specification::NetworkUpdateParameters::MergeFrom(from.updateparams());
  }
  if (from.arrayinputshapemapping() != 0) {
    set_arrayinputshapemapping(from.arrayinputshapemapping());
  }
  if (from.imageinputshapemapping() != 0) {
    set_imageinputshapemapping(from.imageinputshapemapping());
  }
}